

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O3

void __thiscall
Pda::addFunct(Pda *this,Node *from,Node *to,char oldStack,string *newStack,char input)

{
  pointer *pppTVar1;
  iterator __position;
  Transition *this_00;
  Transition *t;
  char local_39;
  Transition *local_38;
  
  local_39 = oldStack;
  this_00 = (Transition *)operator_new(0x40);
  Tjen::Node::Transition::Transition(this_00,from,to,&local_39,newStack,input);
  __position._M_current =
       (this->alltransitions).
       super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_38 = this_00;
  if (__position._M_current ==
      (this->alltransitions).
      super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Tjen::Node::Transition*,std::allocator<Tjen::Node::Transition*>>::
    _M_realloc_insert<Tjen::Node::Transition*const&>
              ((vector<Tjen::Node::Transition*,std::allocator<Tjen::Node::Transition*>> *)
               &this->alltransitions,__position,&local_38);
  }
  else {
    *__position._M_current = this_00;
    pppTVar1 = &(this->alltransitions).
                super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  Tjen::Node::addFunct(from,local_38);
  return;
}

Assistant:

void Pda::addFunct(Tjen::Node *from, Tjen::Node *to, char oldStack, std::string newStack, const char input) {
    Tjen::Node::Transition* t = new Tjen::Node::Transition(from,to,oldStack,newStack,input);
    this->alltransitions.push_back(t);
    from->addFunct(t);
}